

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32_pclmulqdq_tpl.h
# Opt level: O2

void fold_4(__m128i *xmm_crc0,__m128i *xmm_crc1,__m128i *xmm_crc2,__m128i *xmm_crc3)

{
  uint uVar1;
  __m128i alVar2;
  __m128i alVar3;
  __m128i alVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (*xmm_crc0)[1];
  alVar2[0] = 0;
  alVar2[1] = 0;
  for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
    if ((auVar5 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
      alVar2 = (__m128i)((undefined1  [16])alVar2 ^ ZEXT816(0x1c6e41596) << uVar1);
    }
  }
  auVar7._8_8_ = 0;
  auVar7._0_8_ = (*xmm_crc1)[0];
  auVar5 = (undefined1  [16])0x0;
  for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
    if ((ZEXT816(0x154442bd4) & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
      auVar5 = auVar5 ^ auVar7 << uVar1;
    }
  }
  auVar8._8_8_ = 0;
  auVar8._0_8_ = (*xmm_crc2)[0];
  auVar7 = (undefined1  [16])0x0;
  for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
    if ((ZEXT816(0x154442bd4) & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
      auVar7 = auVar7 ^ auVar8 << uVar1;
    }
  }
  auVar9._8_8_ = 0;
  auVar9._0_8_ = (*xmm_crc3)[0];
  auVar8 = (undefined1  [16])0x0;
  for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
    if ((ZEXT816(0x154442bd4) & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
      auVar8 = auVar8 ^ auVar9 << uVar1;
    }
  }
  *xmm_crc0 = alVar2;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (*xmm_crc0)[0];
  auVar9 = (undefined1  [16])0x0;
  for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
    if ((auVar6 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
      auVar9 = auVar9 ^ ZEXT816(0x154442bd4) << uVar1;
    }
  }
  auVar10._8_8_ = 0;
  auVar10._0_8_ = (*xmm_crc1)[1];
  alVar3[0] = 0;
  alVar3[1] = 0;
  for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
    if ((ZEXT816(0x1c6e41596) & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
      alVar3 = (__m128i)((undefined1  [16])alVar3 ^ auVar10 << uVar1);
    }
  }
  *xmm_crc1 = alVar3;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = (*xmm_crc2)[1];
  alVar4[0] = 0;
  alVar4[1] = 0;
  for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
    if ((ZEXT816(0x1c6e41596) & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
      alVar4 = (__m128i)((undefined1  [16])alVar4 ^ auVar11 << uVar1);
    }
  }
  *xmm_crc2 = alVar4;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = (*xmm_crc3)[1];
  auVar6 = (undefined1  [16])0x0;
  for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
    if ((ZEXT816(0x1c6e41596) & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
      auVar6 = auVar6 ^ auVar12 << uVar1;
    }
  }
  *xmm_crc0 = (__m128i)(auVar9 ^ (undefined1  [16])alVar2);
  *xmm_crc1 = (__m128i)(auVar5 ^ (undefined1  [16])alVar3);
  *xmm_crc2 = (__m128i)(auVar7 ^ (undefined1  [16])alVar4);
  *xmm_crc3 = (__m128i)(auVar8 ^ auVar6);
  return;
}

Assistant:

static void fold_4(__m128i *xmm_crc0, __m128i *xmm_crc1, __m128i *xmm_crc2, __m128i *xmm_crc3) {
    const __m128i xmm_fold4 = _mm_set_epi32( 0x00000001, 0x54442bd4,
                                             0x00000001, 0xc6e41596);
    __m128i x_tmp0, x_tmp1, x_tmp2, x_tmp3;
    __m128 ps_crc0, ps_crc1, ps_crc2, ps_crc3;
    __m128 ps_t0, ps_t1, ps_t2, ps_t3;
    __m128 ps_res0, ps_res1, ps_res2, ps_res3;

    x_tmp0 = *xmm_crc0;
    x_tmp1 = *xmm_crc1;
    x_tmp2 = *xmm_crc2;
    x_tmp3 = *xmm_crc3;

    *xmm_crc0 = _mm_clmulepi64_si128(*xmm_crc0, xmm_fold4, 0x01);
    x_tmp0 = _mm_clmulepi64_si128(x_tmp0, xmm_fold4, 0x10);
    ps_crc0 = _mm_castsi128_ps(*xmm_crc0);
    ps_t0 = _mm_castsi128_ps(x_tmp0);
    ps_res0 = _mm_xor_ps(ps_crc0, ps_t0);

    *xmm_crc1 = _mm_clmulepi64_si128(*xmm_crc1, xmm_fold4, 0x01);
    x_tmp1 = _mm_clmulepi64_si128(x_tmp1, xmm_fold4, 0x10);
    ps_crc1 = _mm_castsi128_ps(*xmm_crc1);
    ps_t1 = _mm_castsi128_ps(x_tmp1);
    ps_res1 = _mm_xor_ps(ps_crc1, ps_t1);

    *xmm_crc2 = _mm_clmulepi64_si128(*xmm_crc2, xmm_fold4, 0x01);
    x_tmp2 = _mm_clmulepi64_si128(x_tmp2, xmm_fold4, 0x10);
    ps_crc2 = _mm_castsi128_ps(*xmm_crc2);
    ps_t2 = _mm_castsi128_ps(x_tmp2);
    ps_res2 = _mm_xor_ps(ps_crc2, ps_t2);

    *xmm_crc3 = _mm_clmulepi64_si128(*xmm_crc3, xmm_fold4, 0x01);
    x_tmp3 = _mm_clmulepi64_si128(x_tmp3, xmm_fold4, 0x10);
    ps_crc3 = _mm_castsi128_ps(*xmm_crc3);
    ps_t3 = _mm_castsi128_ps(x_tmp3);
    ps_res3 = _mm_xor_ps(ps_crc3, ps_t3);

    *xmm_crc0 = _mm_castps_si128(ps_res0);
    *xmm_crc1 = _mm_castps_si128(ps_res1);
    *xmm_crc2 = _mm_castps_si128(ps_res2);
    *xmm_crc3 = _mm_castps_si128(ps_res3);
}